

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

u32 utilFNV32(void *buf,size_t count,u32 state)

{
  octet *octets;
  u32 state_local;
  size_t count_local;
  void *buf_local;
  
  octets = (octet *)buf;
  state_local = state;
  count_local = count;
  while (count_local != 0) {
    state_local = (*octets ^ state_local) * 0x1000193;
    octets = octets + 1;
    count_local = count_local - 1;
  }
  return state_local;
}

Assistant:

u32 utilFNV32(const void* buf, size_t count, u32 state)
{
	const octet* octets = (const octet*)buf;
	while (count--)
	{
		state ^= *octets++;
		state += (state << 1) + (state << 4) + (state << 7) +
			(state << 8) + (state << 24);
	}
	return state;
}